

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader::writeVIndices
          (LibraryControllersLoader *this,sint64 *data,size_t length)

{
  undefined4 uVar1;
  undefined8 in_RAX;
  uint64 uVar2;
  size_t i;
  size_t sVar3;
  bool bVar4;
  uint index;
  undefined8 local_38;
  
  bVar4 = this->mCurrentSkinControllerData == (SkinControllerData *)0x0;
  local_38 = CONCAT71((int7)((ulong)in_RAX >> 8),bVar4);
  if (length != 0 && !bVar4) {
    sVar3 = 0;
    do {
      uVar1 = (undefined4)data[sVar3];
      local_38 = CONCAT44(uVar1,(int)local_38);
      if (this->mCurrentOffset == this->mJointOffset) {
        local_38 = CONCAT44(uVar1,uVar1);
        COLLADAFW::ArrayPrimitiveType<int>::append
                  (&this->mCurrentSkinControllerData->mJointIndices,(int *)&local_38);
      }
      if (this->mCurrentOffset == this->mWeightsOffset) {
        COLLADAFW::ArrayPrimitiveType<unsigned_int>::append
                  (&this->mCurrentSkinControllerData->mWeightIndices,(uint *)((long)&local_38 + 4));
      }
      uVar2 = 0;
      if (this->mCurrentOffset != this->mCurrentMaxOffset) {
        uVar2 = this->mCurrentOffset + 1;
      }
      this->mCurrentOffset = uVar2;
      sVar3 = sVar3 + 1;
    } while (length != sVar3);
  }
  return true;
}

Assistant:

bool LibraryControllersLoader::writeVIndices ( const sint64* data, size_t length )
	{
		// check, if we are parsing an unsupported primitive type
		if ( !mCurrentSkinControllerData )
			return true;

		// Write the index values in the index lists.
		for ( size_t i=0; i<length; ++i )
		{
			// Get the current index value.
			unsigned int index = (unsigned int)data [i];

			// Write the indices
			if (  mCurrentOffset == mJointOffset )
			{
				COLLADAFW::IntValuesArray& jointIndices = mCurrentSkinControllerData->getJointIndices();
				jointIndices.append ( index );
			}

			if ( mCurrentOffset == mWeightsOffset )
			{
				COLLADAFW::UIntValuesArray& weightIndices = mCurrentSkinControllerData->getWeightIndices();
				weightIndices.append ( index );
			}

			// Reset the offset if we went through all offset values
			if ( mCurrentOffset == mCurrentMaxOffset )
			{
				// Reset the current offset value
				mCurrentOffset = 0;
			}
			else
			{
				// Increment the current offset value
				++mCurrentOffset;
			}
		}
		return true;
	}